

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

int __thiscall mkvparser::Track::Info::CopyStr(Info *this,offset_in_Info_to_unknown str,Info *dst_)

{
  char *__s;
  size_t __n;
  void *__dest;
  int iVar1;
  
  iVar1 = -1;
  if ((str != 0xffffffffffffffff) && (*(long *)((long)&dst_->type + str) == 0)) {
    __s = *(char **)((long)&this->type + str);
    if (__s != (char *)0x0) {
      __n = strlen(__s);
      if (__n < 0x80000000) {
        __dest = operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
      }
      else {
        __dest = (void *)0x0;
      }
      *(void **)((long)&dst_->type + str) = __dest;
      if (__dest == (void *)0x0) {
        return -1;
      }
      memcpy(__dest,__s,__n);
      *(undefined1 *)((long)__dest + __n) = 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Track::Info::CopyStr(char* Info::*str, Info& dst_) const {
  if (str == static_cast<char * Info::*>(NULL))
    return -1;

  char*& dst = dst_.*str;

  if (dst)  // should be NULL already
    return -1;

  const char* const src = this->*str;

  if (src == NULL)
    return 0;

  const size_t len = strlen(src);

  dst = SafeArrayAlloc<char>(1, len + 1);

  if (dst == NULL)
    return -1;

  memcpy(dst, src, len);
  dst[len] = '\0';

  return 0;
}